

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestAdsPerformance::Read(TestAdsPerformance *this,size_t numLoops)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  test_info *ptVar2;
  pointer pcVar3;
  long lVar4;
  ostream *poVar5;
  size_t sVar6;
  bool bVar7;
  uint32_t buffer;
  uint32_t bytesRead;
  string local_68;
  int local_48;
  uint local_44;
  long local_40;
  size_t local_38;
  
  local_38 = numLoops;
  local_40 = AdsPortOpenEx();
  bVar7 = local_40 != 0;
  ptVar2 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_current_test_info;
  paVar1 = &local_68.field_2;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar7,&local_68,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x3a5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  do {
    if (local_38 != 0) {
      sVar6 = 0;
      do {
        (this->super_test_base<TestAdsPerformance>).super_test_root.m_assertion_tested = true;
        lVar4 = AdsSyncReadReqEx2(local_40,&server,0x4020,0,4,&local_48,&local_44);
        if ((lVar4 != 0) !=
            (this->super_test_base<TestAdsPerformance>).super_test_root.m_reverse_mode) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          bVar7 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_reverse_mode;
          ptVar2 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_current_test_info;
          pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
          local_68._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
          fructose::test_root::test_assert
                    ((test_root *)this,bVar7,&local_68,
                     "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                     ,0x3ad);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar1) {
            operator_delete(local_68._M_dataplus._M_p);
          }
        }
        (this->super_test_base<TestAdsPerformance>).super_test_root.m_assertion_tested = true;
        if ((local_44 != 4) !=
            (this->super_test_base<TestAdsPerformance>).super_test_root.m_reverse_mode) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          bVar7 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_reverse_mode;
          ptVar2 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_current_test_info;
          pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
          local_68._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
          fructose::test_root::test_assert
                    ((test_root *)this,bVar7,&local_68,"sizeof(buffer) == bytesRead",
                     "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                     ,0x3ae);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar1) {
            operator_delete(local_68._M_dataplus._M_p);
          }
        }
        (this->super_test_base<TestAdsPerformance>).super_test_root.m_assertion_tested = true;
        if ((local_48 != 0) !=
            (this->super_test_base<TestAdsPerformance>).super_test_root.m_reverse_mode) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          bVar7 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_reverse_mode;
          ptVar2 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_current_test_info;
          pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
          local_68._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
          fructose::test_root::test_assert
                    ((test_root *)this,bVar7,&local_68,"0 == buffer",
                     "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                     ,0x3af);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar1) {
            operator_delete(local_68._M_dataplus._M_p);
          }
        }
        sVar6 = sVar6 + 1;
      } while (local_38 != sVar6);
    }
  } while (this->runEndurance != false);
  lVar4 = AdsPortCloseEx(local_40);
  ptVar2 = (this->super_test_base<TestAdsPerformance>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0,&local_68,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x3b2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Read(const size_t numLoops)
    {
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        uint32_t bytesRead;
        uint32_t buffer;
        do {
            for (size_t i = 0; i < numLoops; ++i) {
                fructose_loop_assert(i,
                                     0 ==
                                     AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
                fructose_loop_assert(i, sizeof(buffer) == bytesRead);
                fructose_loop_assert(i, 0 == buffer);
            }
        } while (runEndurance);
        fructose_assert(0 == AdsPortCloseEx(port));
    }